

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button_widgets.cpp
# Opt level: O1

void Am_Choice_List_Interim_Do_proc(Am_Object *inter)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Wrapper *pAVar3;
  Am_Object_Method *this;
  Am_Object ref_object;
  Am_Object new_object;
  Am_Object old_object;
  Am_Choice_How_Set how_set;
  Am_Object AStack_48;
  Am_Object_Method local_40;
  Am_Object local_30;
  Am_Object_Method local_28;
  
  pAVar2 = Am_Object::Get(inter,0xd4,0);
  if ((pAVar2->type != 1) && (pAVar2->type != Am_Choice_How_Set::Am_Choice_How_Set_ID)) {
    Am_Choice_How_Set::TypeError((Am_Choice_How_Set *)&local_28.Call,pAVar2);
  }
  local_28.Call = (Am_Object_Method_Type *)(pAVar2->value).wrapper_value;
  if (local_28.Call == (Am_Object_Method_Type *)Am_CHOICE_LIST_TOGGLE.value) {
    pAVar2 = Am_Object::Get(inter,0x16a,0);
    Am_Object::Am_Object((Am_Object *)&local_40,pAVar2);
    bVar1 = Am_Object::Valid((Am_Object *)&local_40);
    if (bVar1) {
      pAVar2 = Am_Object::Get(inter,0x12e,0);
      Am_Object::Am_Object(&AStack_48,pAVar2);
      pAVar2 = Am_Object::Get(inter,0x1ef,0);
      Am_Object::Am_Object(&local_30,pAVar2);
      bVar1 = Am_Object::Valid(&AStack_48);
      if (!bVar1) {
        Am_Object::operator=(&AStack_48,(Am_Object *)&local_40);
        pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&AStack_48);
        Am_Object::Set(inter,0x12e,pAVar3,1);
      }
      list_set_and_clear(inter,&local_30,(Am_Object *)&local_40,&AStack_48);
      pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)&local_40);
      Am_Object::Set(inter,0x1ef,pAVar3,0);
      Am_Object::~Am_Object(&local_30);
      Am_Object::~Am_Object(&AStack_48);
    }
    this = &local_40;
  }
  else {
    pAVar2 = Am_Object::Get(&Am_Choice_Interactor,200,0);
    Am_Object_Method::Am_Object_Method(&local_40,pAVar2);
    Am_Object::Am_Object((Am_Object *)&local_28,inter);
    (*local_40.Call)((Am_Object_Data *)&local_28);
    this = &local_28;
  }
  Am_Object::~Am_Object((Am_Object *)this);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, Am_Choice_List_Interim_Do,
                 (Am_Object inter))
{
  Am_Choice_How_Set how_set = inter.Get(Am_HOW_SET);
  if (how_set == Am_CHOICE_LIST_TOGGLE) {
    Am_Object new_object = inter.Get(Am_INTERIM_VALUE);
    if (!new_object.Valid())
      return; //don't do anything if outside

    Am_Object ref_object = inter.Get(Am_INITIAL_REF_OBJECT);
    Am_Object old_object = inter.Get(Am_LAST_USED_OLD_INTERIM_VALUE);

    if (!ref_object.Valid()) {
      ref_object = new_object;
      inter.Set(Am_INITIAL_REF_OBJECT, ref_object, Am_OK_IF_NOT_THERE);
    }
    list_set_and_clear(inter, old_object, new_object, ref_object);
    inter.Set(Am_LAST_USED_OLD_INTERIM_VALUE, new_object);
  } else {
    //use the standard method
    Am_Object_Method method = Am_Choice_Interactor.Get(Am_INTERIM_DO_METHOD);
    method.Call(inter);
  }
}